

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.h
# Opt level: O0

void __thiscall chrono::robosimian::MeshShape::MeshShape(MeshShape *this,MeshShape *param_1)

{
  MeshShape *param_1_local;
  MeshShape *this_local;
  
  ChVector<double>::ChVector(&this->m_pos,&param_1->m_pos);
  ChQuaternion<double>::ChQuaternion(&this->m_rot,&param_1->m_rot);
  std::__cxx11::string::string((string *)&this->m_name,(string *)&param_1->m_name);
  this->m_type = param_1->m_type;
  return;
}

Assistant:

struct CH_MODELS_API MeshShape {
    enum class Type { CONVEX_HULL, TRIANGLE_SOUP, NODE_CLOUD };
    MeshShape(const chrono::ChVector<>& pos, const chrono::ChQuaternion<>& rot, const std::string& name, Type type)
        : m_pos(pos), m_rot(rot), m_name(name), m_type(type) {}
    chrono::ChVector<> m_pos;
    chrono::ChQuaternion<> m_rot;
    std::string m_name;
    Type m_type;
}